

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O2

string * __thiscall
chaiscript::ChaiScript_Basic::get_type_name<Type_Name_MyClass>
          (string *__return_storage_ptr__,ChaiScript_Basic *this)

{
  Type_Info local_20;
  
  local_20.m_type_info = (type_info *)&Type_Name_MyClass::typeinfo;
  local_20.m_bare_type_info = (type_info *)&Type_Name_MyClass::typeinfo;
  local_20.m_flags = 0;
  detail::Dispatch_Engine::get_type_name_abi_cxx11_
            (__return_storage_ptr__,&this->m_engine,&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string get_type_name() const {
      return get_type_name(user_type<T>());
    }